

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

bool __thiscall
GdlRenderer::CheckTablesAndPasses(GdlRenderer *this,GrcManager *pcman,int *pcpassValid)

{
  string sta4;
  int __val;
  GdlRuleTable *pGVar1;
  int *in_RCX;
  string *this_00;
  undefined1 auStack_160 [16];
  int nPassNum;
  undefined4 uStack_14c;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  nPassNum = 0;
  this->m_ipassBidi = -1;
  std::__cxx11::string::string((string *)&local_68,"linebreak",(allocator *)(auStack_160 + 0xf));
  pGVar1 = FindRuleTable(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar1,pcman,&nPassNum,in_RCX);
  }
  std::__cxx11::string::string((string *)&local_88,"substitution",(allocator *)(auStack_160 + 0xf));
  pGVar1 = FindRuleTable(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar1,pcman,&nPassNum,in_RCX);
  }
  std::__cxx11::string::string((string *)&local_a8,"justification",(allocator *)(auStack_160 + 0xf))
  ;
  pGVar1 = FindRuleTable(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar1,pcman,&nPassNum,in_RCX);
  }
  std::__cxx11::string::string((string *)&local_c8,"positioning",(allocator *)(auStack_160 + 0xf));
  pGVar1 = FindRuleTable(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar1,pcman,&nPassNum,in_RCX);
  }
  __val = nPassNum;
  *pcpassValid = nPassNum;
  if ((0 < this->m_nBidi) && (this->m_ipassBidi == -1)) {
    this->m_ipassBidi = nPassNum;
  }
  if (nPassNum < 0x80) {
    if (nPassNum != 0) {
      return true;
    }
    std::__cxx11::string::string
              ((string *)&local_148,"No valid passes",(allocator *)(auStack_160 + 0xf));
    GrcErrorList::AddWarning(&g_errorList,0xdae,(GdlObject *)0x0,&local_148);
    this_00 = &local_148;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_e8,"Number of passes (",(allocator *)(auStack_160 + 0xf));
    std::__cxx11::to_string(&local_108,__val);
    std::__cxx11::string::string
              ((string *)&local_128,") exceeds maximum of ",(allocator *)((long)&uStack_14c + 3));
    std::__cxx11::to_string(&local_48,0x7f);
    sta4._8_16_ = auStack_160;
    sta4._M_dataplus._M_p = (pointer)&local_48;
    sta4.field_2._8_4_ = nPassNum;
    sta4.field_2._12_4_ = uStack_14c;
    GrcErrorList::AddError(&g_errorList,0xc1d,(GdlObject *)0x0,&local_e8,&local_108,&local_128,sta4)
    ;
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    this_00 = &local_e8;
  }
  std::__cxx11::string::~string((string *)this_00);
  return true;
}

Assistant:

bool GdlRenderer::CheckTablesAndPasses(GrcManager * pcman, int * pcpassValid)
{
	int nPassNum = 0;

	GdlRuleTable * prultbl;

	m_ipassBidi = -1;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	//if (Bidi())
	//	m_ipassBidi = nPassNum;
	//else
	//	m_ipassBidi = -1;

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	//	At this point nPassNum = the number of valid passes.
	*pcpassValid = nPassNum;

	if (this->Bidi() && m_ipassBidi == -1)
		m_ipassBidi = nPassNum;

	if (nPassNum >= kMaxPasses)
	{
		g_errorList.AddError(3101, NULL,
			"Number of passes (",
			std::to_string(nPassNum),
			") exceeds maximum of ",
			std::to_string(kMaxPasses - 1));
	}
	else if (nPassNum == 0)
	{
		g_errorList.AddWarning(3502, NULL,
			"No valid passes");
	}

	return true;
}